

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::DescriptorTableName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FileDescriptor *file,Options *options)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"descriptor_table",&local_41);
  UniqueName(__return_storage_ptr__,&local_40,(FileDescriptor *)this,(Options *)file);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorTableName(const FileDescriptor* file,
                                const Options& options) {
  return UniqueName("descriptor_table", file, options);
}